

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O2

MapModuleMemoryRegion * __thiscall remote::Handle::GetRegionOfAddress(Handle *this,void *address)

{
  long lVar1;
  MapModuleMemoryRegion *pMVar2;
  size_t i;
  ulong uVar3;
  
  pMVar2 = (this->regions).
           super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->regions).
                super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2;
  uVar3 = 0;
  while( true ) {
    if ((ulong)(lVar1 / 0x78) <= uVar3) {
      return (MapModuleMemoryRegion *)0x0;
    }
    if ((address < (void *)pMVar2->start) &&
       ((void *)((long)pMVar2->start + pMVar2->end) <= address)) break;
    uVar3 = uVar3 + 1;
    pMVar2 = pMVar2 + 1;
  }
  return pMVar2;
}

Assistant:

MapModuleMemoryRegion* Handle::GetRegionOfAddress(void* address) {
        for(size_t i = 0; i < regions.size(); i++) {
            if(regions[i].start > (unsigned long) address && (regions[i].start + regions[i].end) <= (unsigned long) address) {
                return &regions[i];
            }
        }

        return NULL;
    }